

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

stbtt__buf stbtt__cff_get_index(stbtt__buf *b)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  stbtt__buf sVar11;
  
  uVar1 = b->cursor;
  uVar8 = 0;
  iVar3 = 2;
  uVar6 = (ulong)uVar1;
  do {
    iVar4 = (int)uVar6;
    if (iVar4 < b->size) {
      uVar6 = (ulong)(iVar4 + 1U);
      b->cursor = iVar4 + 1U;
      uVar7 = (uint)b->data[iVar4];
    }
    else {
      uVar7 = 0;
    }
    uVar8 = uVar8 << 8 | uVar7;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if (uVar8 != 0) {
    iVar3 = b->cursor;
    if (iVar3 < b->size) {
      b->cursor = iVar3 + 1;
      bVar10 = b->data[iVar3];
    }
    else {
      bVar10 = 0;
    }
    if (3 < (byte)(bVar10 - 1)) {
      __assert_fail("offsize >= 1 && offsize <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imstb_truetype.h"
                    ,0x49c,"stbtt__buf stbtt__cff_get_index(stbtt__buf *)");
    }
    uVar7 = (uint)bVar10;
    stbtt__buf_skip(b,uVar8 * uVar7);
    if (bVar10 == 0) {
      iVar3 = -1;
    }
    else {
      iVar3 = b->cursor;
      uVar8 = 0;
      do {
        if (iVar3 < b->size) {
          lVar9 = (long)iVar3;
          iVar3 = iVar3 + 1;
          b->cursor = iVar3;
          uVar5 = (uint)b->data[lVar9];
        }
        else {
          uVar5 = 0;
        }
        uVar8 = uVar8 << 8 | uVar5;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      iVar3 = uVar8 - 1;
    }
    stbtt__buf_skip(b,iVar3);
  }
  uVar8 = b->cursor - uVar1;
  if ((int)(uVar8 | uVar1) < 0) {
    puVar2 = (uchar *)0x0;
    lVar9 = 0;
  }
  else {
    puVar2 = (uchar *)0x0;
    lVar9 = 0;
    if (b->cursor <= b->size && (int)uVar1 <= b->size) {
      puVar2 = b->data + uVar1;
      lVar9 = (ulong)uVar8 << 0x20;
    }
  }
  sVar11.cursor = (int)lVar9;
  sVar11.size = (int)((ulong)lVar9 >> 0x20);
  sVar11.data = puVar2;
  return sVar11;
}

Assistant:

static stbtt__buf stbtt__cff_get_index(stbtt__buf *b)
{
   int count, start, offsize;
   start = b->cursor;
   count = stbtt__buf_get16(b);
   if (count) {
      offsize = stbtt__buf_get8(b);
      STBTT_assert(offsize >= 1 && offsize <= 4);
      stbtt__buf_skip(b, offsize * count);
      stbtt__buf_skip(b, stbtt__buf_get(b, offsize) - 1);
   }
   return stbtt__buf_range(b, start, b->cursor - start);
}